

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void duckdb_fmt::v6::internal::check_pointer_type_spec<char,duckdb_fmt::v6::internal::error_handler>
               (char spec,error_handler *eh)

{
  int iVar1;
  undefined7 in_register_00000039;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  if ((iVar1 != 0) && (iVar1 != 0x70)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
    std::operator+(&local_50,"Invalid type specifier \"",&local_70);
    std::operator+(&local_30,&local_50,"\" for formatting a value of type pointer");
    error_handler::on_error(eh,&local_30);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void check_pointer_type_spec(Char spec, ErrorHandler&& eh) {
  if (spec != 0 && spec != 'p') eh.on_error("Invalid type specifier \"" + std::string(1, spec) + "\" for formatting a value of type pointer");
}